

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

void __thiscall AActor::RestoreSpecialPosition(AActor *this)

{
  double *pdVar1;
  double dVar2;
  sector_t *psVar3;
  int iVar4;
  uint uVar5;
  double dVar6;
  FLinkContext ctx;
  FLinkContext local_28;
  
  dVar2 = (this->SpawnPoint).X;
  dVar6 = (this->SpawnPoint).Y;
  local_28.sector_list = (msecnode_t *)0x0;
  local_28.render_list = (msecnode_t *)0x0;
  UnlinkFromWorld(this,&local_28);
  (this->__Pos).X = dVar2;
  (this->__Pos).Y = dVar6;
  LinkToWorld(this,&local_28,true,(sector_t *)0x0);
  psVar3 = this->Sector;
  (this->__Pos).Z =
       (dVar6 * (psVar3->floorplane).normal.Y +
       dVar2 * (psVar3->floorplane).normal.X + (psVar3->floorplane).D) * (psVar3->floorplane).negiC;
  P_FindFloorCeiling(this,0x11);
  if (((this->flags).Value & 0x100) == 0) {
    if (((this->flags2).Value & 0x40) == 0) {
      dVar2 = (this->SpawnPoint).Z + this->floorz;
    }
    else {
      dVar2 = this->floorz;
      dVar6 = (this->ceilingz - this->Height) - dVar2;
      if (48.0 < dVar6) {
        uVar5 = FRandom::GenRand32(&pr_restore);
        dVar2 = (double)(uVar5 & 0xff) * (dVar6 + -40.0) * 0.00390625 + this->floorz + 40.0;
      }
    }
  }
  else {
    dVar2 = (this->ceilingz - this->Height) - (this->SpawnPoint).Z;
  }
  (this->__Pos).Z = dVar2;
  P_FindFloorCeiling(this,0xe);
  dVar2 = this->floorz;
  pdVar1 = &(this->__Pos).Z;
  if (*pdVar1 <= dVar2 && dVar2 != *pdVar1) {
    (this->__Pos).Z = dVar2;
  }
  if (((this->flags).Value & 2) != 0) {
    if (this->ceilingz < (this->__Pos).Z + this->Height) {
      (this->__Pos).Z = this->ceilingz - this->Height;
    }
  }
  dVar2 = (this->__Pos).X;
  dVar6 = (this->__Pos).Y;
  (this->Prev).Z = (this->__Pos).Z;
  (this->Prev).X = dVar2;
  (this->Prev).Y = dVar6;
  (this->PrevAngles).Roll.Degrees = (this->Angles).Roll.Degrees;
  dVar2 = (this->Angles).Yaw.Degrees;
  (this->PrevAngles).Pitch.Degrees = (this->Angles).Pitch.Degrees;
  (this->PrevAngles).Yaw.Degrees = dVar2;
  if (this->Sector == (sector_t *)0x0) {
    iVar4 = 0;
  }
  else {
    iVar4 = this->Sector->PortalGroup;
  }
  this->PrevPortalGroup = iVar4;
  return;
}

Assistant:

void AActor::RestoreSpecialPosition()
{
	// Move item back to its original location
	DVector2 sp = SpawnPoint;

	FLinkContext ctx;
	UnlinkFromWorld(&ctx);
	SetXY(sp);
	LinkToWorld(&ctx, true);
	SetZ(Sector->floorplane.ZatPoint(sp));
	P_FindFloorCeiling(this, FFCF_ONLYSPAWNPOS | FFCF_NOPORTALS);	// no portal checks here so that things get spawned in this sector.

	if (flags & MF_SPAWNCEILING)
	{
		SetZ(ceilingz - Height - SpawnPoint.Z);
	}
	else if (flags2 & MF2_SPAWNFLOAT)
	{
		double space = ceilingz - Height - floorz;
		if (space > 48)
		{
			space -= 40;
			SetZ((space * pr_restore()) / 256. + floorz + 40);
		}
		else
		{
			SetZ(floorz);
		}
	}
	else
	{
		SetZ(SpawnPoint.Z + floorz);
	}
	// Redo floor/ceiling check, in case of 3D floors and portals
	P_FindFloorCeiling(this, FFCF_SAMESECTOR | FFCF_ONLY3DFLOORS | FFCF_3DRESTRICT);
	if (Z() < floorz)
	{ // Do not reappear under the floor, even if that's where we were for the
	  // initial spawn.
		SetZ(floorz);
	}
	if ((flags & MF_SOLID) && (Top() > ceilingz))
	{ // Do the same for the ceiling.
		SetZ(ceilingz - Height);
	}
	// Do not interpolate from the position the actor was at when it was
	// picked up, in case that is different from where it is now.
	ClearInterpolation();
}